

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O3

Abc_Obj_t * Mpm_ManGetAbcNode(Abc_Ntk_t *pNtk,Vec_Int_t *vCopy,int iMigLit)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  
  if ((-1 < iMigLit) && (iMigLit < vCopy->nSize)) {
    iVar1 = vCopy->pArray[(uint)iMigLit];
    if ((long)iVar1 < 0) {
      if ((uint)vCopy->nSize <= (iMigLit ^ 1U)) goto LAB_0047b1ef;
      iVar1 = vCopy->pArray[iMigLit ^ 1U];
      if ((long)iVar1 < 0) {
        __assert_fail("iObjId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                      ,0x9e,"Abc_Obj_t *Mpm_ManGetAbcNode(Abc_Ntk_t *, Vec_Int_t *, int)");
      }
      if (pNtk->vObjs->nSize <= iVar1) goto LAB_0047b20e;
      pAVar2 = Abc_NtkCreateNodeInv(pNtk,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar1]);
      if (vCopy->nSize <= iMigLit) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vCopy->pArray[(uint)iMigLit] = pAVar2->Id;
    }
    else {
      if (pNtk->vObjs->nSize <= iVar1) {
LAB_0047b20e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar2 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar1];
    }
    return pAVar2;
  }
LAB_0047b1ef:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Obj_t * Mpm_ManGetAbcNode( Abc_Ntk_t * pNtk, Vec_Int_t * vCopy, int iMigLit )
{
    Abc_Obj_t * pObj;
    int iObjId = Vec_IntEntry( vCopy, iMigLit );
    if ( iObjId >= 0 )
        return Abc_NtkObj( pNtk, iObjId );
    iObjId = Vec_IntEntry( vCopy, Abc_LitNot(iMigLit) );
    assert( iObjId >= 0 );
    pObj = Abc_NtkCreateNodeInv( pNtk, Abc_NtkObj(pNtk, iObjId) );
    Vec_IntWriteEntry( vCopy, iMigLit, Abc_ObjId(pObj) );
    return pObj;
}